

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# live.cc
# Opt level: O0

csptr __thiscall pstack::Procman::LiveProcess::getAUXV(LiveProcess *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  csptr cVar1;
  shared_ptr<pstack::Procman::LiveReader> local_28;
  LiveProcess *this_local;
  
  this_local = this;
  std::make_shared<pstack::Procman::LiveReader,pstack::Context&,int_const&,char_const(&)[5]>
            ((Context *)&local_28,*(int **)(in_RSI + 0xa0),(char (*) [5])(in_RSI + 0xb8));
  std::shared_ptr<pstack::Reader_const>::shared_ptr<pstack::Procman::LiveReader,void>
            ((shared_ptr<pstack::Reader_const> *)this,&local_28);
  std::shared_ptr<pstack::Procman::LiveReader>::~shared_ptr(&local_28);
  cVar1.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  cVar1.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (csptr)cVar1.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Reader::csptr LiveProcess::getAUXV() const {
    return std::make_shared<LiveReader>(context, pid, "auxv");
}